

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_constructor_test.h
# Opt level: O0

void __thiscall
phmap::priv::gtest_suite_ConstructorTest_::
AssignmentFromInitializerListOverwritesExisting<phmap::parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>_>
::TestBody(AssignmentFromInitializerListOverwritesExisting<phmap::parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>_>
           *this)

{
  Generator<std::pair<const_int,_int>,_void> *this_00;
  iterator this_01;
  initializer_list<std::pair<const_int,_int>_> iVar1;
  bool bVar2;
  char *message;
  size_type sVar3;
  parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>
  *m_00;
  initializer_list<std::pair<const_int,_int>_> xs;
  AssertHelper local_a20;
  Message local_a18;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_a10;
  iterator local_9f8;
  iterator ppStack_9f0;
  UnorderedElementsAreArrayMatcher<std::pair<const_int,_int>_> local_9e0;
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<const_int,_int>_>_>
  local_9c0;
  undefined1 local_9a0 [8];
  AssertionResult gtest_ar;
  StatefulTestingEqual local_988 [3];
  StatefulTestingHash local_970;
  iterator local_968;
  iterator ppStack_960;
  parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>
  local_950;
  undefined1 local_4d0 [8];
  TypeParam m;
  initializer_list<std::pair<const_int,_int>_> values;
  Generator<std::pair<const_int,_int>,_void> gen;
  AssignmentFromInitializerListOverwritesExisting<phmap::parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>_>
  *this_local;
  UnorderedElementsAreArrayMatcher<std::pair<const_int,_int>_> *matcher;
  
  this_00 = (Generator<std::pair<const_int,_int>,_void> *)((long)&values._M_len + 7);
  m.
  super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  .
  super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  .sets_._M_elems[0xf].set_.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
       (unsigned_long)hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()(this_00)
  ;
  hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()(this_00);
  hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()(this_00);
  hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()(this_00);
  hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()(this_00);
  this_01 = (iterator)
            ((long)&m.
                    super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                    .
                    super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                    .sets_._M_elems[0xf].set_.settings_ + 0x18);
  values._M_array = (iterator)0x5;
  parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>
  ::parallel_flat_hash_map
            ((parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>
              *)local_4d0);
  ppStack_960 = values._M_array;
  local_970.super_WithId<phmap::priv::StatefulTestingHash>.id_ =
       (WithId<phmap::priv::StatefulTestingHash>)0;
  local_968 = this_01;
  StatefulTestingHash::StatefulTestingHash(&local_970);
  local_988[0].super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
       (WithId<phmap::priv::StatefulTestingEqual>)0;
  StatefulTestingEqual::StatefulTestingEqual(local_988);
  Alloc<std::pair<const_int,_int>_>::Alloc
            ((Alloc<std::pair<const_int,_int>_> *)&gtest_ar.message_,0);
  iVar1._M_len = (size_type)ppStack_960;
  iVar1._M_array = local_968;
  sVar3 = 0;
  parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>
  ::parallel_hash_set(&local_950,iVar1,0,&local_970,local_988,(allocator_type *)&gtest_ar.message_);
  parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>
  ::operator=((parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>
               *)local_4d0,&local_950);
  parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>
  ::~parallel_flat_hash_map(&local_950);
  Alloc<std::pair<const_int,_int>_>::~Alloc((Alloc<std::pair<const_int,_int>_> *)&gtest_ar.message_)
  ;
  ppStack_9f0 = values._M_array;
  xs._M_len = sVar3;
  xs._M_array = values._M_array;
  local_9f8 = this_01;
  testing::UnorderedElementsAreArray<std::pair<int_const,int>>(&local_9e0,(testing *)this_01,xs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<int_const,int>>>
            (&local_9c0,(internal *)&local_9e0,matcher);
  items<phmap::parallel_flat_hash_map<int,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>,4ul,phmap::NullMutex>>
            (&local_a10,(priv *)local_4d0,m_00);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<int_const,int>>>
  ::operator()(local_9a0,(char *)&local_9c0,
               (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)"items(m)");
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector(&local_a10);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<const_int,_int>_>_>
  ::~PredicateFormatterFromMatcher(&local_9c0);
  testing::internal::UnorderedElementsAreArrayMatcher<std::pair<const_int,_int>_>::
  ~UnorderedElementsAreArrayMatcher(&local_9e0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9a0);
  if (!bVar2) {
    testing::Message::Message(&local_a18);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_9a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_a20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x1d2,message);
    testing::internal::AssertHelper::operator=(&local_a20,&local_a18);
    testing::internal::AssertHelper::~AssertHelper(&local_a20);
    testing::Message::~Message(&local_a18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9a0);
  parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>
  ::~parallel_flat_hash_map
            ((parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>
              *)local_4d0);
  return;
}

Assistant:

TYPED_TEST_P(ConstructorTest, AssignmentFromInitializerListOverwritesExisting) {
  using T = hash_internal::GeneratedType<TypeParam>;
  hash_internal::Generator<T> gen;
  std::initializer_list<T> values = {gen(), gen(), gen(), gen(), gen()};
  TypeParam m;
  m = values;
  EXPECT_THAT(items(m), ::testing::UnorderedElementsAreArray(values));
}